

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O0

counter * counter::instance(string *name)

{
  int iVar1;
  __type _Var2;
  int iVar3;
  string *in_RDI;
  int i;
  counter *in_stack_ffffffffffffffc0;
  counter *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  counter *local_8;
  
  if ((instance(std::__cxx11::string_const&)::all == '\0') &&
     (iVar3 = __cxa_guard_acquire(&instance(std::__cxx11::string_const&)::all), iVar3 != 0)) {
    in_stack_ffffffffffffffd8 = instance::all;
    do {
      counter(in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1;
    } while (in_stack_ffffffffffffffd8 != (counter *)&instance(std::__cxx11::string_const&)::all);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&instance(std::__cxx11::string_const&)::all);
  }
  for (iVar3 = 0; iVar3 < instance::curr; iVar3 = iVar3 + 1) {
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffe4,iVar3),
                            &in_stack_ffffffffffffffd8->name);
    iVar1 = instance::curr;
    if (_Var2) goto LAB_0011a282;
  }
  std::__cxx11::string::operator=((string *)(instance::all + instance::curr),in_RDI);
  iVar1 = instance::curr + 1;
  iVar3 = instance::curr;
LAB_0011a282:
  instance::curr = iVar1;
  local_8 = instance::all + iVar3;
  return local_8;
}

Assistant:

static counter *instance(std::string const &name)
	{
		static const int max = 20;
		static int curr;
		static counter all[max];
		for(int i=0;i<curr;i++)
			if(all[i].name==name)
				return all + i;
		assert(curr < max);
		all[curr].name = name;
		return all + curr++;
	}